

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  TestFilter *pTVar1;
  TestFilter *current;
  TestFilter *pTVar2;
  
  this->_vptr_CommandLineArguments = (_func_int **)&PTR__CommandLineArguments_00165cf8;
  pTVar2 = this->groupFilters_;
  while (pTVar2 != (TestFilter *)0x0) {
    pTVar1 = TestFilter::getNext(pTVar2);
    this->groupFilters_ = pTVar1;
    SimpleString::~SimpleString(&pTVar2->filter_);
    operator_delete(pTVar2,0x20);
    pTVar2 = this->groupFilters_;
  }
  while (pTVar2 = this->nameFilters_, pTVar2 != (TestFilter *)0x0) {
    pTVar1 = TestFilter::getNext(pTVar2);
    this->nameFilters_ = pTVar1;
    SimpleString::~SimpleString(&pTVar2->filter_);
    operator_delete(pTVar2,0x20);
  }
  SimpleString::~SimpleString(&this->packageName_);
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
    while(groupFilters_) {
        TestFilter* current = groupFilters_;
        groupFilters_ = groupFilters_->getNext();
        delete current;
    }
    while(nameFilters_) {
        TestFilter* current = nameFilters_;
        nameFilters_ = nameFilters_->getNext();
        delete current;
    }
}